

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O3

void __thiscall
CATCH2_INTERNAL_TEST_0()::TestSession::next(std::__cxx11::string_const&,FIX::
UtcTimeStamp_const__bool_(void *this,string *param_1,UtcTimeStamp *timeStamp,bool queued)

{
  InvalidMessage *this_00;
  string local_40;
  
  if (*(char *)((long)this + 0x880) != '\x01') {
    return;
  }
  this_00 = (InvalidMessage *)__cxa_allocate_exception(0x50);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  FIX::InvalidMessage::InvalidMessage(this_00,&local_40);
  __cxa_throw(this_00,&FIX::InvalidMessage::typeinfo,FIX::Exception::~Exception);
}

Assistant:

virtual void next(const std::string &, const UtcTimeStamp &timeStamp, bool queued = false) {
      if (nextThrowInvalidMsg) {
        throw InvalidMessage();
      }
    }